

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::setChecked(QAbstractButton *this,bool checked)

{
  byte checked_00;
  byte bVar1;
  bool bVar2;
  State state;
  QAbstractButtonPrivate *pQVar3;
  QButtonGroupPrivate *pQVar4;
  byte in_SIL;
  QAbstractButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractButtonPrivate *d;
  QPointer<QAbstractButton> guard;
  QAccessibleStateChangeEvent event;
  State s;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffffa0;
  QAbstractButtonPrivate *this_00;
  QAbstractButtonPrivate *in_stack_ffffffffffffffb8;
  QAccessibleStateChangeEvent local_38 [40];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  checked_00 = in_SIL & 1;
  this_00 = in_RDI;
  state = (State)d_func((QAbstractButton *)0x4fe233);
  if (((*(byte *)((long)state + 0x28c) & 1) == 0) ||
     ((*(byte *)((long)state + 0x28c) >> 1 & 1) == (checked_00 & 1))) {
    if ((*(byte *)((long)state + 0x28c) >> 5 & 1) == 0) {
      (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x1a8))();
    }
  }
  else {
    if (((checked_00 & 1) == 0) &&
       (pQVar3 = (QAbstractButtonPrivate *)
                 QAbstractButtonPrivate::queryCheckedButton(in_stack_ffffffffffffffb8),
       pQVar3 == in_RDI)) {
      if (*(QButtonGroup **)((long)state + 0x290) == (QButtonGroup *)0x0) {
        bVar1 = *(byte *)((long)state + 0x28c) >> 3;
      }
      else {
        pQVar4 = QButtonGroup::d_func((QButtonGroup *)0x4fe2db);
        bVar1 = pQVar4->exclusive;
      }
      in_stack_ffffffffffffff8c = (uint)(bVar1 & 1);
      if (in_stack_ffffffffffffff8c != 0) goto LAB_004fe480;
      if (*(QButtonGroup **)((long)state + 0x290) != (QButtonGroup *)0x0) {
        QButtonGroup::d_func((QButtonGroup *)0x4fe331);
        QButtonGroupPrivate::detectCheckedButton
                  ((QButtonGroupPrivate *)CONCAT17(checked_00,in_stack_ffffffffffffffa0));
      }
    }
    pQVar3 = (QAbstractButtonPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QPointer<QAbstractButton>::QPointer<void>
              ((QPointer<QAbstractButton> *)in_RDI,
               (QAbstractButton *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    *(byte *)((long)state + 0x28c) = *(byte *)((long)state + 0x28c) & 0xfd | (checked_00 & 1) << 1;
    if ((*(byte *)((long)state + 0x28c) >> 5 & 1) == 0) {
      (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x1a8))();
    }
    QAbstractButtonPrivate::refresh(in_RDI);
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4fe3c2);
    if ((bVar2) && ((checked_00 & 1) != 0)) {
      QAbstractButtonPrivate::notifyChecked(pQVar3);
    }
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4fe3e3);
    if (bVar2) {
      QAbstractButtonPrivate::emitToggled(this_00,(bool)checked_00);
    }
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4fe406);
    if (bVar2) {
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QAccessible::State::State((State *)0x4fe422);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffffbf | 0x40);
      memset(local_38,0xaa,0x28);
      QAccessibleStateChangeEvent::QAccessibleStateChangeEvent
                ((QAccessibleStateChangeEvent *)in_RDI,
                 (QObject *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),state);
      QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
      QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent(local_38);
    }
    QPointer<QAbstractButton>::~QPointer((QPointer<QAbstractButton> *)0x4fe480);
  }
LAB_004fe480:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::setChecked(bool checked)
{
    Q_D(QAbstractButton);
    if (!d->checkable || d->checked == checked) {
        if (!d->blockRefresh)
            checkStateSet();
        return;
    }

    if (!checked && d->queryCheckedButton() == this) {
        // the checked button of an exclusive or autoexclusive group cannot be  unchecked
#if QT_CONFIG(buttongroup)
        if (d->group ? d->group->d_func()->exclusive : d->autoExclusive)
            return;
        if (d->group)
            d->group->d_func()->detectCheckedButton();
#else
        if (d->autoExclusive)
            return;
#endif
    }

    QPointer<QAbstractButton> guard(this);

    d->checked = checked;
    if (!d->blockRefresh)
        checkStateSet();
    d->refresh();

    if (guard && checked)
        d->notifyChecked();
    if (guard)
        d->emitToggled(checked);

#if QT_CONFIG(accessibility)
    if (guard) {
        QAccessible::State s;
        s.checked = true;
        QAccessibleStateChangeEvent event(this, s);
        QAccessible::updateAccessibility(&event);
    }
#endif
}